

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_plugin.c
# Opt level: O3

void mk_plugin_exit_all(mk_server *server)

{
  mk_list *pmVar1;
  mk_list *pmVar2;
  mk_list *pmVar3;
  mk_list *pmVar4;
  mk_list *pmVar5;
  mk_list *pmVar6;
  mk_list *__mptr_1;
  mk_list *__mptr;
  mk_list *pmVar7;
  
  pmVar1 = &server->plugins;
  pmVar7 = (server->plugins).next;
  if (pmVar7 != pmVar1) {
    do {
      (*(code *)pmVar7[-4].prev)(&pmVar7[-8].next);
      pmVar7 = pmVar7->next;
    } while (pmVar7 != pmVar1);
    pmVar7 = (server->plugins).next;
  }
  while (pmVar6 = pmVar7, pmVar6 != pmVar1) {
    pmVar2 = pmVar6->prev;
    pmVar7 = pmVar6->next;
    pmVar2->next = pmVar7;
    pmVar7->prev = pmVar2;
    pmVar6->prev = (mk_list *)0x0;
    pmVar6->next = (mk_list *)0x0;
    pmVar2 = pmVar6[1].next;
    while (pmVar2 != pmVar6 + 1) {
      pmVar3 = pmVar2->next;
      pmVar4 = pmVar2[-1].prev;
      pmVar5 = pmVar2[-1].next;
      pmVar4->next = pmVar5;
      pmVar5->prev = pmVar4;
      pmVar2[-1].prev = (mk_list *)0x0;
      pmVar2[-1].next = (mk_list *)0x0;
      pmVar4 = pmVar2->prev;
      pmVar5 = pmVar2->next;
      pmVar4->next = pmVar5;
      pmVar5->prev = pmVar4;
      pmVar2->prev = (mk_list *)0x0;
      pmVar2->next = (mk_list *)0x0;
      free(pmVar2 + -5);
      pmVar2 = pmVar3;
    }
    if (*(int *)&pmVar6[2].prev == 0) {
      if (pmVar6[-3].next != (mk_list *)0x0) {
        free(pmVar6[-3].next);
      }
      free(&pmVar6[-8].next);
    }
    else if (*(int *)&pmVar6[2].prev == 1) {
      free(pmVar6[-1].prev);
      dlclose(pmVar6[-2].next);
    }
  }
  free(server->api);
  return;
}

Assistant:

void mk_plugin_exit_all(struct mk_server *server)
{
    struct mk_plugin *plugin;
    struct mk_list *head, *tmp;

    /* Plugins */
    mk_list_foreach(head, &server->plugins) {
        plugin = mk_list_entry(head, struct mk_plugin, _head);
        plugin->exit_plugin(plugin);
    }

    /* Plugin interface it self */
    mk_list_foreach_safe(head, tmp, &server->plugins) {
        plugin = mk_list_entry(head, struct mk_plugin, _head);
        mk_list_del(&plugin->_head);
        mk_plugin_exit_stages(plugin);

        if (plugin->load_type == MK_PLUGIN_DYNAMIC) {
            mk_mem_free(plugin->path);
#ifdef _WIN32
            FreeLibrary((HMODULE)plugin->handler);
#else
            dlclose(plugin ->handler);
#endif
        }
        else if (plugin->load_type == MK_PLUGIN_STATIC) {
            if (plugin->network != NULL) {
                mk_mem_free(plugin->network);
            }

            mk_mem_free(plugin);
        }
    }

    mk_mem_free(server->api);
    mk_mem_free(plg_stagemap);
}